

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScatteringRadiusCovariances.test.cpp
# Opt level: O3

string * chunk_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 0.000000+0 0.000000+0          0          0          0          3943732151     \n 0.000000+0 0.000000+0          0          5          7          3943732151     \n 0.000000+0 1.000000+2 2.000000+2 1.000000+0 2.000000+0 3.000000+0943732151     \n 4.000000+0                                                       943732151     \n 0.000000+0 0.000000+0          0          6         13          3943732151     \n 1.100000+0 1.200000+0 1.300000+0 2.100000+0 2.200000+0 2.300000+0943732151     \n 2.400000+0 1.000000+0 2.000000+0 3.000000+0 4.000000+0 5.000000+0943732151     \n 6.000000+0                                                       943732151     \n 0.000000+0 0.000000+0          0          1          4          2943732151     \n 1.000000+0 2.000000+0 3.000000+0 4.000000+0                      943732151     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunk() {

  return
    " 0.000000+0 0.000000+0          0          0          0          3943732151     \n"
    " 0.000000+0 0.000000+0          0          5          7          3943732151     \n"
    " 0.000000+0 1.000000+2 2.000000+2 1.000000+0 2.000000+0 3.000000+0943732151     \n"
    " 4.000000+0                                                       943732151     \n"
    " 0.000000+0 0.000000+0          0          6         13          3943732151     \n"
    " 1.100000+0 1.200000+0 1.300000+0 2.100000+0 2.200000+0 2.300000+0943732151     \n"
    " 2.400000+0 1.000000+0 2.000000+0 3.000000+0 4.000000+0 5.000000+0943732151     \n"
    " 6.000000+0                                                       943732151     \n"
    " 0.000000+0 0.000000+0          0          1          4          2943732151     \n"
    " 1.000000+0 2.000000+0 3.000000+0 4.000000+0                      943732151     \n";
}